

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int check_plan(void)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int local_28;
  undefined4 uStack_24;
  int local_1c;
  
  lVar2 = (long)level;
  iVar3 = 0;
  iVar1 = level;
  if (tests_done[lVar2] != plan_test[lVar2]) {
    check_plan_cold_1();
    lVar2 = CONCAT44(uStack_24,local_28);
    iVar3 = -1;
    iVar1 = local_1c;
  }
  if (tests_failed[lVar2] != 0) {
    check_plan_cold_2();
    iVar1 = local_1c;
    iVar3 = local_28;
  }
  level = iVar1 + -1;
  if (0 < iVar1) {
    __ok((uint)(iVar3 == 0),"subtests");
    if (iVar3 != 0) {
      check_plan_cold_3();
    }
  }
  return iVar3;
}

Assistant:

int
check_plan(void)
{
	int r = 0;
	if (tests_done[level] != plan_test[level]) {
		__space(stderr);
		fprintf(stderr,
			"# Looks like you planned %d tests but ran %d.\n",
			plan_test[level], tests_done[level]);
		r = -1;
	}

	if (tests_failed[level]) {
		__space(stderr);
		fprintf(stderr,
			"# Looks like you failed %d test of %d run.\n",
			tests_failed[level], tests_done[level]);
		r = tests_failed[level];
	}
	--level;
	if (level >= 0) {
		is(r, 0, "subtests");
	}
	return r;
}